

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

CharIterator * __thiscall
absl::lts_20250127::Cord::Find(CharIterator *__return_storage_ptr__,Cord *this,string_view needle)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  ulong size_to_compare;
  CharIterator *this_00;
  size_t *psVar4;
  size_t rhs_size;
  byte bVar5;
  ChunkIterator in_stack_fffffffffffffe98;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  CharIterator local_c0;
  
  size_to_compare = needle._M_len;
  bVar5 = 0;
  if (size_to_compare == 0) {
LAB_0031e1d4:
    CharIterator::CharIterator(__return_storage_ptr__,this);
  }
  else {
    uVar2 = (ulong)(this->contents_).data_.rep_.field_0.data[0];
    if ((uVar2 & 1) == 0) {
      uVar2 = uVar2 >> 1;
    }
    else {
      uVar2 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
    }
    if (size_to_compare <= uVar2) {
      if (uVar2 != size_to_compare) {
        CharIterator::CharIterator(&local_c0,this);
        this_00 = &local_c0;
        psVar4 = (size_t *)&stack0xfffffffffffffe98;
        for (lVar3 = 0x13; lVar3 != 0; lVar3 = lVar3 + -1) {
          *psVar4 = (this_00->chunk_iterator_).current_chunk_._M_len;
          this_00 = (CharIterator *)((long)this_00 + ((ulong)bVar5 * -2 + 1) * 8);
          psVar4 = psVar4 + (ulong)bVar5 * -2 + 1;
        }
        FindImpl(__return_storage_ptr__,(Cord *)this_00,(CharIterator)in_stack_fffffffffffffe98,
                 needle);
        return __return_storage_ptr__;
      }
      local_d0._M_len = size_to_compare;
      local_d0._M_str = needle._M_str;
      bVar1 = GenericCompare<bool,std::basic_string_view<char,std::char_traits<char>>>
                        (this,&local_d0,size_to_compare);
      if (bVar1) goto LAB_0031e1d4;
    }
    memset(__return_storage_ptr__,0,0x98);
    (__return_storage_ptr__->chunk_iterator_).btree_reader_.navigator_.height_ = -1;
  }
  return __return_storage_ptr__;
}

Assistant:

absl::Cord::CharIterator absl::Cord::Find(absl::string_view needle) const {
  if (needle.empty()) {
    return char_begin();
  }
  if (needle.size() > size()) {
    return char_end();
  }
  if (needle.size() == size()) {
    return *this == needle ? char_begin() : char_end();
  }
  return FindImpl(char_begin(), needle);
}